

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_strtoi(char *str,char **endptr)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *p;
  char *pcVar4;
  
  if (str != (char *)0x0) {
    do {
      pcVar4 = str;
      str = pcVar4 + 1;
      cVar1 = *pcVar4;
    } while (cVar1 == ' ');
    if (cVar1 == '-') {
      cVar1 = *str;
      iVar3 = -1;
      pcVar4 = str;
    }
    else {
      iVar3 = 1;
    }
    iVar2 = 0;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar2 = 0;
      do {
        iVar2 = (uint)(byte)(cVar1 - 0x30) + iVar2 * 10;
        cVar1 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      } while ((byte)(cVar1 - 0x30U) < 10);
    }
    if (endptr != (char **)0x0) {
      *endptr = pcVar4;
    }
    return iVar2 * iVar3;
  }
  return 0;
}

Assistant:

NK_API int
nk_strtoi(const char *str, const char **endptr)
{
int neg = 1;
const char *p = str;
int value = 0;

NK_ASSERT(str);
if (!str) return 0;

/* skip whitespace */
while (*p == ' ') p++;
if (*p == '-') {
neg = -1;
p++;
}
while (*p && *p >= '0' && *p <= '9') {
value = value * 10 + (int) (*p - '0');
p++;
}
if (endptr)
*endptr = p;
return neg*value;
}